

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O0

v2d __thiscall
idx2::brick_copier::Copy
          (brick_copier *this,extent *ExtentGlobal,extent *ExtentLocal,brick_volume *Brick)

{
  anon_union_16_4_6ba14846_for_v2<double>_1 aVar1;
  v2d vVar2;
  brick_copier *local_60;
  double local_58;
  brick_copier *local_50;
  double local_48;
  brick_volume *Brick_local;
  extent *ExtentLocal_local;
  extent *ExtentGlobal_local;
  brick_copier *this_local;
  v2d MinMax;
  
  MinMax.field_0.field_0.Y = (double)&this_local;
  if (this->Volume->Type == float32) {
    vVar2 = CopyExtentExtentMinMax<float,double>(ExtentGlobal,this->Volume,ExtentLocal,&Brick->Vol);
    local_50 = vVar2.field_0._0_8_;
    this_local = local_50;
    local_48 = vVar2.field_0._8_8_;
    MinMax.field_0.field_0.X = local_48;
  }
  else if (this->Volume->Type == float64) {
    vVar2 = CopyExtentExtentMinMax<double,double>(ExtentGlobal,this->Volume,ExtentLocal,&Brick->Vol)
    ;
    local_60 = vVar2.field_0._0_8_;
    this_local = local_60;
    local_58 = vVar2.field_0._8_8_;
    MinMax.field_0.field_0.X = local_58;
  }
  aVar1.field_0.Y = MinMax.field_0.field_0.X;
  aVar1.field_0.X = (double)this_local;
  return (anon_union_16_4_6ba14846_for_v2<double>_1)
         (anon_union_16_4_6ba14846_for_v2<double>_1)aVar1.field_0;
}

Assistant:

v2d
brick_copier::Copy(const extent& ExtentGlobal, const extent& ExtentLocal, brick_volume* Brick)
{
  v2d MinMax;
  if (Volume->Type == dtype::float32)
    MinMax = (CopyExtentExtentMinMax<f32, f64>(ExtentGlobal, *Volume, ExtentLocal, &Brick->Vol));
  else if (Volume->Type == dtype::float64)
    MinMax = (CopyExtentExtentMinMax<f64, f64>(ExtentGlobal, *Volume, ExtentLocal, &Brick->Vol));

  return MinMax;
}